

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

ostream * outputBitMapFileHeader(ostream *os,BitMapFileHeader *bitMapFileHeader)

{
  char cVar1;
  
  cVar1 = (char)os;
  std::ostream::put(cVar1);
  std::ostream::put(cVar1);
  putInt(os,bitMapFileHeader->bfSize);
  std::ostream::put(cVar1);
  std::ostream::put(cVar1);
  std::ostream::put(cVar1);
  std::ostream::put(cVar1);
  putInt(os,bitMapFileHeader->bfOffBits);
  return os;
}

Assistant:

std::ostream& outputBitMapFileHeader(std::ostream& os, const BitMapFileHeader& bitMapFileHeader) {
    os.put('B');
    os.put('M');
    putInt(os, bitMapFileHeader.bfSize);
    putShort(os, bitMapFileHeader.bfReserved1);
    putShort(os, bitMapFileHeader.bfReserved2);
    putInt(os, bitMapFileHeader.bfOffBits);
    return os;
}